

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool_persist.cpp
# Opt level: O1

bool node::LoadMempool(CTxMemPool *pool,path *load_path,Chainstate *active_chainstate,
                      ImportMempoolOptions *opts)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  element_type *peVar6;
  bool bVar7;
  time_point tVar8;
  pointer __dest;
  Logger *pLVar9;
  undefined8 uVar10;
  _Rb_tree_node_base *p_Var11;
  long *plVar12;
  ImportMempoolOptions *__nbytes;
  int iVar13;
  iterator __begin3;
  int __fd;
  char *args_2;
  iterator __end3;
  ulong uVar14;
  size_t sVar15;
  undefined1 accept_time [8];
  long in_FS_OFFSET;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  undefined1 auVar18 [12];
  int percentage_done;
  uint64_t txns_tried;
  uint64_t total_txns_to_load;
  vector<std::byte,_std::allocator<std::byte>_> xor_key;
  int64_t unbroadcast;
  int64_t already_there;
  int64_t failed;
  int64_t expired;
  int64_t count;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> unbroadcast_txids;
  string log_msg;
  CAmount amountdelta;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock7;
  CTransactionRef tx;
  char *in_stack_fffffffffffffd70;
  char **in_stack_fffffffffffffd78;
  unsigned_long local_258;
  int local_24c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_240;
  vector<std::byte,_std::allocator<std::byte>_> local_238;
  vector<std::byte,_std::allocator<std::byte>_> local_218;
  size_t local_1f8;
  long local_1f0;
  long local_1e8;
  long local_1e0;
  long local_1d8;
  AutoFile local_1d0;
  undefined1 local_1a8 [32];
  uchar uStack_188;
  undefined7 uStack_187;
  size_t local_180;
  undefined1 local_178 [8];
  AutoFile *local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  _Alloc_hider local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_128 [3];
  _Storage<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false>
  local_e0;
  bool local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98 [4];
  unique_lock<std::recursive_mutex> local_78 [2];
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((load_path->super_path)._M_pathname._M_string_length == 0) {
    bVar7 = false;
  }
  else {
    local_178 = (undefined1  [8])0xf6af0c;
    if ((opts->mockable_fopen_function).super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_0097fca5:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0098036c;
      auVar18 = std::__throw_bad_function_call();
      if (local_178 != (undefined1  [8])&local_168) {
        operator_delete((void *)local_178,local_168._M_allocated_capacity + 1);
      }
      if (local_218.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_218.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_218.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_218.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (auVar18._8_4_ != 1) {
        AutoFile::~AutoFile(&local_1d0);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          _Unwind_Resume(auVar18._0_8_);
        }
        goto LAB_0098036c;
      }
      plVar12 = (long *)__cxa_begin_catch(auVar18._0_8_);
      local_58 = (element_type *)(**(code **)(*plVar12 + 0x10))(plVar12);
      source_file_03._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/mempool_persist.cpp"
      ;
      source_file_03._M_len = 0x61;
      logging_function_00._M_str = "LoadMempool";
      logging_function_00._M_len = 0xb;
      LogPrintf_<char_const*>
                (logging_function_00,source_file_03,0x8d,
                 IPC|I2P|VALIDATION|LEVELDB|QT|COINDB|LIBEVENT|RAND|CMPCTBLOCK|REINDEX|ESTIMATEFEE|
                 RPC|WALLETDB|BENCH|MEMPOOL,(Level)&stack0xffffffffffffffa8,
                 in_stack_fffffffffffffd70,in_stack_fffffffffffffd78);
      __cxa_end_catch();
    }
    else {
      __nbytes = opts;
      local_1d0.m_file =
           (*(opts->mockable_fopen_function)._M_invoker)
                     ((_Any_data *)opts,load_path,(char **)local_178);
      local_1d0.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_1d0.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1d0.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (local_1d0.m_file != (_IO_FILE *)0x0) {
        local_1d8 = 0;
        local_1e0 = 0;
        local_1e8 = 0;
        local_1f0 = 0;
        local_1f8 = 0;
        tVar8 = NodeClock::now();
        AutoFile::read(&local_1d0,(int)local_178,&DAT_00000008,(size_t)__nbytes);
        local_218.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_218.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_218.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (local_178 != (undefined1  [8])0x1) {
          if (local_178 != (undefined1  [8])0x2) goto LAB_0097fb07;
          AutoFile::operator>>(&local_1d0,&local_218);
        }
        local_238.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_238.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_238.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar14 = (long)local_218.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_218.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start;
        if (uVar14 == 0) {
          __dest = (pointer)0x0;
LAB_0097f286:
          local_238.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = __dest + uVar14;
          sVar15 = (long)local_218.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl
                         .super__Vector_impl_data._M_finish -
                   (long)local_218.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl
                         .super__Vector_impl_data._M_start;
          local_238.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start = __dest;
          if (sVar15 != 0) {
            local_238.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_finish = __dest;
            memmove(__dest,local_218.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                           _M_impl.super__Vector_impl_data._M_start,sVar15);
          }
          local_238.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_finish = __dest + sVar15;
          std::vector<std::byte,_std::allocator<std::byte>_>::operator=(&local_1d0.m_xor,&local_238)
          ;
          if (local_238.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_238.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_238.
                                  super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_238.
                                  super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          AutoFile::read(&local_1d0,(int)local_178,&DAT_00000008,(size_t)__nbytes);
          local_240 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_178;
          local_248 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
          args_2 = "Loading %u mempool transactions from file...\n";
          source_file_02._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/mempool_persist.cpp"
          ;
          source_file_02._M_len = 0x61;
          logging_function._M_str = "LoadMempool";
          logging_function._M_len = 0xb;
          LogPrintf_<unsigned_long>
                    (logging_function,source_file_02,0x49,
                     IPC|I2P|VALIDATION|LEVELDB|QT|COINDB|LIBEVENT|RAND|CMPCTBLOCK|REINDEX|
                     ESTIMATEFEE|WALLETDB|BENCH|MEMPOOL|TOR,(Level)&local_240,
                     in_stack_fffffffffffffd70,(unsigned_long *)in_stack_fffffffffffffd78);
          iVar13 = 0;
LAB_0097f37e:
          paVar5 = local_240;
          paVar4 = local_248;
          if (local_248 <= local_240 && (long)local_240 - (long)local_248 != 0)
          goto code_r0x0097f394;
          local_170 = (AutoFile *)((ulong)local_170 & 0xffffffff00000000);
          local_168._M_allocated_capacity = 0;
          local_158._8_8_ = 0;
          local_168._8_8_ = (_Rb_tree_node_base *)&local_170;
          local_158._M_allocated_capacity = (size_type)(_Rb_tree_node_base *)&local_170;
          Unserialize<AutoFile,uint256,long,std::less<uint256>,std::allocator<std::pair<uint256_const,long>>>
                    (&local_1d0,
                     (map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
                      *)local_178);
          uVar10 = local_168._8_8_;
          if (((_Rb_tree_node_base *)local_168._8_8_ != (_Rb_tree_node_base *)&local_170 &
              opts->apply_fee_delta_priority) == 1) {
            do {
              CTxMemPool::PrioritiseTransaction
                        (pool,(uint256 *)(uVar10 + 0x20),(CAmount *)(uVar10 + 0x40));
              uVar10 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar10);
            } while ((_Rb_tree_node_base *)uVar10 != (_Rb_tree_node_base *)&local_170);
          }
          local_1a8._8_4_ = _S_red;
          local_1a8[0x10] = '\0';
          local_1a8._17_7_ = 0;
          local_1a8[0x18] = SUB81(local_1a8 + 8,0);
          local_1a8._25_7_ = (undefined7)((ulong)(local_1a8 + 8) >> 8);
          local_180 = 0;
          uStack_188 = local_1a8[0x18];
          uStack_187 = local_1a8._25_7_;
          Unserialize<AutoFile,uint256,std::less<uint256>,std::allocator<uint256>>
                    (&local_1d0,
                     (set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)local_1a8);
          if (opts->apply_unbroadcast_set == true) {
            local_1f8 = local_180;
            for (p_Var11 = (_Rb_tree_node_base *)CONCAT71(local_1a8._25_7_,local_1a8[0x18]);
                p_Var11 != (_Rb_tree_node_base *)(local_1a8 + 8);
                p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
              CTxMemPool::get((CTxMemPool *)&stack0xffffffffffffffa8,(uint256 *)pool);
              peVar6 = local_58;
              if (_Stack_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_50._M_pi);
              }
              if (peVar6 != (element_type *)0x0) {
                CTxMemPool::AddUnbroadcastTx(pool,(uint256 *)(p_Var11 + 1));
              }
            }
          }
          std::
          _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
          ::~_Rb_tree((_Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
                       *)local_1a8);
          std::
          _Rb_tree<uint256,_std::pair<const_uint256,_long>,_std::_Select1st<std::pair<const_uint256,_long>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
          ::~_Rb_tree((_Rb_tree<uint256,_std::pair<const_uint256,_long>,_std::_Select1st<std::pair<const_uint256,_long>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
                       *)local_178);
LAB_0097fae5:
          if (local_218.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_218.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_218.
                                  super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_218.
                                  super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (paVar4 < paVar5) goto LAB_0097fb07;
          pLVar9 = LogInstance();
          bVar7 = BCLog::Logger::Enabled(pLVar9);
          if (bVar7) {
            local_178 = (undefined1  [8])&local_168;
            local_170 = (AutoFile *)0x0;
            local_168._M_allocated_capacity = local_168._M_allocated_capacity & 0xffffffffffffff00;
            tinyformat::format<long,long,long,long,long>
                      ((string *)local_1a8,
                       (tinyformat *)
                       "Imported mempool transactions from file: %i succeeded, %i failed, %i expired, %i already there, %i waiting for initial broadcast\n"
                       ,(char *)&local_1d8,&local_1e8,&local_1e0,&local_1f0,(long *)&local_1f8,
                       (long *)in_stack_fffffffffffffd70);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178
                      ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8);
            if ((undefined1 *)CONCAT71(local_1a8._1_7_,local_1a8[0]) != local_1a8 + 0x10) {
              operator_delete((undefined1 *)CONCAT71(local_1a8._1_7_,local_1a8[0]),
                              CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
            }
            pLVar9 = LogInstance();
            local_1a8[0] = true;
            local_1a8[1] = '\0';
            local_1a8[2] = '\0';
            local_1a8[3] = '\0';
            local_1a8[4] = '\0';
            local_1a8[5] = '\0';
            local_1a8[6] = '\0';
            local_1a8[7] = '\0';
            local_1a8._8_4_ = 0xfe38c3;
            local_1a8._12_4_ = 0;
            source_file_01._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/mempool_persist.cpp"
            ;
            source_file_01._M_len = 0x61;
            str_01._M_str = (char *)local_178;
            str_01._M_len = (size_t)local_170;
            logging_function_03._M_str = "LoadMempool";
            logging_function_03._M_len = 0xb;
            BCLog::Logger::LogPrintStr
                      (pLVar9,str_01,logging_function_03,source_file_01,0x91,ALL,Info);
            if (local_178 != (undefined1  [8])&local_168) {
              operator_delete((void *)local_178,local_168._M_allocated_capacity + 1);
            }
          }
          bVar7 = true;
          goto LAB_0097fb1e;
        }
        if (-1 < (long)uVar14) {
          __dest = (pointer)operator_new(uVar14);
          goto LAB_0097f286;
        }
        if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0098036c;
        std::__throw_bad_alloc();
        goto LAB_0097fca5;
      }
      pLVar9 = LogInstance();
      bVar7 = BCLog::Logger::Enabled(pLVar9);
      if (bVar7) {
        local_170 = (AutoFile *)0x0;
        local_168._M_allocated_capacity = local_168._M_allocated_capacity & 0xffffffffffffff00;
        local_178 = (undefined1  [8])&local_168;
        tinyformat::format<>
                  ((string *)local_1a8,"Failed to open mempool file. Continuing anyway.\n");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
        if ((undefined1 *)CONCAT71(local_1a8._1_7_,local_1a8[0]) != local_1a8 + 0x10) {
          operator_delete((undefined1 *)CONCAT71(local_1a8._1_7_,local_1a8[0]),
                          CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
        }
        pLVar9 = LogInstance();
        local_1a8[0] = true;
        local_1a8[1] = '\0';
        local_1a8[2] = '\0';
        local_1a8[3] = '\0';
        local_1a8[4] = '\0';
        local_1a8[5] = '\0';
        local_1a8[6] = '\0';
        local_1a8[7] = '\0';
        local_1a8._8_4_ = 0xfe38c3;
        local_1a8._12_4_ = 0;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/mempool_persist.cpp"
        ;
        source_file._M_len = 0x61;
        str._M_str = (char *)local_178;
        str._M_len = (size_t)local_170;
        logging_function_01._M_str = "LoadMempool";
        logging_function_01._M_len = 0xb;
        BCLog::Logger::LogPrintStr(pLVar9,str,logging_function_01,source_file,0x2f,ALL,Info);
        if (local_178 != (undefined1  [8])&local_168) {
          operator_delete((void *)local_178,local_168._M_allocated_capacity + 1);
        }
      }
    }
LAB_0097fb07:
    bVar7 = false;
LAB_0097fb1e:
    AutoFile::~AutoFile(&local_1d0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar7;
  }
LAB_0098036c:
  __stack_chk_fail();
code_r0x0097f394:
  auVar16._8_4_ = (int)((ulong)local_248 >> 0x20);
  auVar16._0_8_ = local_248;
  auVar16._12_4_ = 0x45300000;
  auVar17._8_4_ = (int)((ulong)local_240 >> 0x20);
  auVar17._0_8_ = local_240;
  auVar17._12_4_ = 0x45300000;
  local_24c = (int)((((auVar16._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)local_248) - 4503599627370496.0)) * 100.0) /
                   ((auVar17._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)local_240) - 4503599627370496.0)));
  sVar15 = (size_t)(uint)(local_24c / 10);
  if (iVar13 < local_24c / 10) {
    local_258 = (long)local_240 - (long)local_248;
    pLVar9 = LogInstance();
    bVar7 = BCLog::Logger::Enabled(pLVar9);
    if (bVar7) {
      local_178 = (undefined1  [8])&local_168;
      local_170 = (AutoFile *)0x0;
      local_168._M_allocated_capacity = local_168._M_allocated_capacity & 0xffffffffffffff00;
      tinyformat::format<int,unsigned_long,unsigned_long>
                ((string *)local_1a8,
                 (tinyformat *)
                 "Progress loading mempool transactions from file: %d%% (tried %u, %u remaining)\n",
                 (char *)&local_24c,(int *)&local_248,&local_258,(unsigned_long *)args_2);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
                 (string *)local_1a8);
      if ((undefined1 *)CONCAT71(local_1a8._1_7_,local_1a8[0]) != local_1a8 + 0x10) {
        operator_delete((undefined1 *)CONCAT71(local_1a8._1_7_,local_1a8[0]),
                        CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
      }
      pLVar9 = LogInstance();
      local_1a8[0] = true;
      local_1a8[1] = '\0';
      local_1a8[2] = '\0';
      local_1a8[3] = '\0';
      local_1a8[4] = '\0';
      local_1a8[5] = '\0';
      local_1a8[6] = '\0';
      local_1a8[7] = '\0';
      local_1a8._8_4_ = 0xfe38c3;
      local_1a8._12_4_ = 0;
      in_stack_fffffffffffffd70 =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/mempool_persist.cpp"
      ;
      args_2 = (char *)0x4f;
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/mempool_persist.cpp"
      ;
      source_file_00._M_len = 0x61;
      str_00._M_str = (char *)local_178;
      str_00._M_len = (size_t)local_170;
      logging_function_02._M_str = "LoadMempool";
      logging_function_02._M_len = 0xb;
      sVar15 = 0xb;
      BCLog::Logger::LogPrintStr(pLVar9,str_00,logging_function_02,source_file_00,0x4f,ALL,Info);
      if (local_178 != (undefined1  [8])&local_168) {
        operator_delete((void *)local_178,local_168._M_allocated_capacity + 1);
      }
    }
    iVar13 = local_24c / 10;
  }
  local_248 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_248->_M_local_buf + 1);
  local_58 = (element_type *)0x0;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_178 = (undefined1  [8])&::TX_WITH_WITNESS;
  local_170 = &local_1d0;
  Unserialize<ParamsStream<AutoFile&,TransactionSerParams>,CTransaction>
            ((ParamsStream<AutoFile_&,_TransactionSerParams> *)local_178,
             (shared_ptr<const_CTransaction> *)&stack0xffffffffffffffa8);
  __fd = (int)(MempoolAcceptResult *)local_178;
  AutoFile::read(&local_1d0,__fd,&DAT_00000008,sVar15);
  accept_time = local_178;
  AutoFile::read(&local_1d0,__fd,&DAT_00000008,sVar15);
  if (opts->use_current_time != false) {
    accept_time = (undefined1  [8])((long)tVar8.__d.__r / 1000000000);
  }
  local_98[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178;
  if ((local_178 != (undefined1  [8])0x0) && (opts->apply_fee_delta_priority == true)) {
    CTxMemPool::PrioritiseTransaction(pool,&(local_58->hash).m_wrapped,(CAmount *)local_98);
  }
  if (((pool->m_opts).expiry.__r * -1000000000 + (long)tVar8.__d.__r) / 1000000000 <
      (long)accept_time) {
    local_78[0]._M_device = &cs_main.super_recursive_mutex;
    local_78[0]._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(local_78);
    args_2 = (char *)0x0;
    AcceptToMemoryPool((MempoolAcceptResult *)local_178,active_chainstate,
                       (CTransactionRef *)&stack0xffffffffffffffa8,(int64_t)accept_time,false,false)
    ;
    if (local_178._0_4_ == VALID) {
      local_1d8 = local_1d8 + 1;
    }
    else {
      local_1a8[0] = false;
      uVar10 = *(undefined8 *)(local_58->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      uVar1 = *(undefined8 *)((local_58->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      uVar2 = *(undefined8 *)
               ((local_58->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      uVar3 = *(undefined8 *)
               ((local_58->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      local_1a8._17_7_ = (undefined7)uVar2;
      local_1a8[0x18] = (undefined1)((ulong)uVar2 >> 0x38);
      local_1a8._25_7_ = (undefined7)uVar3;
      uStack_188 = (uchar)((ulong)uVar3 >> 0x38);
      local_1a8._1_7_ = (undefined7)uVar10;
      local_1a8[8] = (undefined1)((ulong)uVar10 >> 0x38);
      local_1a8._9_3_ = (undefined3)uVar1;
      local_1a8._12_4_ = (undefined4)((ulong)uVar1 >> 0x18);
      local_1a8[0x10] = (undefined1)((ulong)uVar1 >> 0x38);
      bVar7 = CTxMemPool::exists(pool,(GenTxid *)local_1a8);
      if (bVar7) {
        local_1f0 = local_1f0 + 1;
      }
      else {
        local_1e8 = local_1e8 + 1;
      }
    }
    if ((local_c8 == true) &&
       (local_c8 = false,
       local_e0._M_value.
       super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
       ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
      operator_delete(local_e0._M_value.
                      super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_e0._M_value.
                            super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage - local_e0._0_8_);
    }
    std::__cxx11::
    _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::_M_clear(local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_p != &local_138) {
      operator_delete(local_148._M_p,local_138._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_allocated_capacity != &local_158) {
      operator_delete((void *)local_168._M_allocated_capacity,
                      (ulong)(local_158._M_allocated_capacity + 1));
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(local_78);
  }
  else {
    local_1e0 = local_1e0 + 1;
  }
  bVar7 = util::SignalInterrupt::operator_cast_to_bool(active_chainstate->m_chainman->m_interrupt);
  if (_Stack_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_50._M_pi);
  }
  if (bVar7) goto LAB_0097fae5;
  goto LAB_0097f37e;
}

Assistant:

bool LoadMempool(CTxMemPool& pool, const fs::path& load_path, Chainstate& active_chainstate, ImportMempoolOptions&& opts)
{
    if (load_path.empty()) return false;

    AutoFile file{opts.mockable_fopen_function(load_path, "rb")};
    if (file.IsNull()) {
        LogInfo("Failed to open mempool file. Continuing anyway.\n");
        return false;
    }

    int64_t count = 0;
    int64_t expired = 0;
    int64_t failed = 0;
    int64_t already_there = 0;
    int64_t unbroadcast = 0;
    const auto now{NodeClock::now()};

    try {
        uint64_t version;
        file >> version;
        std::vector<std::byte> xor_key;
        if (version == MEMPOOL_DUMP_VERSION_NO_XOR_KEY) {
            // Leave XOR-key empty
        } else if (version == MEMPOOL_DUMP_VERSION) {
            file >> xor_key;
        } else {
            return false;
        }
        file.SetXor(xor_key);
        uint64_t total_txns_to_load;
        file >> total_txns_to_load;
        uint64_t txns_tried = 0;
        LogInfo("Loading %u mempool transactions from file...\n", total_txns_to_load);
        int next_tenth_to_report = 0;
        while (txns_tried < total_txns_to_load) {
            const int percentage_done(100.0 * txns_tried / total_txns_to_load);
            if (next_tenth_to_report < percentage_done / 10) {
                LogInfo("Progress loading mempool transactions from file: %d%% (tried %u, %u remaining)\n",
                        percentage_done, txns_tried, total_txns_to_load - txns_tried);
                next_tenth_to_report = percentage_done / 10;
            }
            ++txns_tried;

            CTransactionRef tx;
            int64_t nTime;
            int64_t nFeeDelta;
            file >> TX_WITH_WITNESS(tx);
            file >> nTime;
            file >> nFeeDelta;

            if (opts.use_current_time) {
                nTime = TicksSinceEpoch<std::chrono::seconds>(now);
            }

            CAmount amountdelta = nFeeDelta;
            if (amountdelta && opts.apply_fee_delta_priority) {
                pool.PrioritiseTransaction(tx->GetHash(), amountdelta);
            }
            if (nTime > TicksSinceEpoch<std::chrono::seconds>(now - pool.m_opts.expiry)) {
                LOCK(cs_main);
                const auto& accepted = AcceptToMemoryPool(active_chainstate, tx, nTime, /*bypass_limits=*/false, /*test_accept=*/false);
                if (accepted.m_result_type == MempoolAcceptResult::ResultType::VALID) {
                    ++count;
                } else {
                    // mempool may contain the transaction already, e.g. from
                    // wallet(s) having loaded it while we were processing
                    // mempool transactions; consider these as valid, instead of
                    // failed, but mark them as 'already there'
                    if (pool.exists(GenTxid::Txid(tx->GetHash()))) {
                        ++already_there;
                    } else {
                        ++failed;
                    }
                }
            } else {
                ++expired;
            }
            if (active_chainstate.m_chainman.m_interrupt)
                return false;
        }
        std::map<uint256, CAmount> mapDeltas;
        file >> mapDeltas;

        if (opts.apply_fee_delta_priority) {
            for (const auto& i : mapDeltas) {
                pool.PrioritiseTransaction(i.first, i.second);
            }
        }

        std::set<uint256> unbroadcast_txids;
        file >> unbroadcast_txids;
        if (opts.apply_unbroadcast_set) {
            unbroadcast = unbroadcast_txids.size();
            for (const auto& txid : unbroadcast_txids) {
                // Ensure transactions were accepted to mempool then add to
                // unbroadcast set.
                if (pool.get(txid) != nullptr) pool.AddUnbroadcastTx(txid);
            }
        }
    } catch (const std::exception& e) {
        LogInfo("Failed to deserialize mempool data on file: %s. Continuing anyway.\n", e.what());
        return false;
    }

    LogInfo("Imported mempool transactions from file: %i succeeded, %i failed, %i expired, %i already there, %i waiting for initial broadcast\n", count, failed, expired, already_there, unbroadcast);
    return true;
}